

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::flush_control_dependent_expressions(Compiler *this,uint32_t block_id)

{
  uint32_t local_44;
  TypedID<(spirv_cross::Types)0> *local_40;
  TypedID<(spirv_cross::Types)0> *expr;
  TypedID<(spirv_cross::Types)0> *__end1;
  TypedID<(spirv_cross::Types)0> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range1;
  SPIRBlock *block;
  Compiler *pCStack_10;
  uint32_t block_id_local;
  Compiler *this_local;
  
  block._4_4_ = block_id;
  pCStack_10 = this;
  __range1 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
             get<spirv_cross::SPIRBlock>(this,block_id);
  __begin1 = (TypedID<(spirv_cross::Types)0> *)&((SPIRBlock *)__range1)->invalidate_expressions;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  expr = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                   ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  for (; __end1 != expr; __end1 = __end1 + 1) {
    local_40 = __end1;
    local_44 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->invalid_expressions,&local_44);
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::clear
            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)
             &__range1[0x10].stack_storage);
  return;
}

Assistant:

void Compiler::flush_control_dependent_expressions(uint32_t block_id)
{
	auto &block = get<SPIRBlock>(block_id);
	for (auto &expr : block.invalidate_expressions)
		invalid_expressions.insert(expr);
	block.invalidate_expressions.clear();
}